

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

int capnp::_::OrphanBuilder::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  Reader value;
  WirePointer *this;
  uchar *puVar1;
  CapTableBuilder *in_RCX;
  SegmentBuilder *in_RDX;
  BuilderArena *in_R8;
  size_t in_stack_ffffffffffffff60;
  undefined1 local_50 [8];
  SegmentAnd<capnp::Data::Builder> allocation;
  CapTableBuilder *capTable_local;
  BuilderArena *arena_local;
  Reader copyFrom_local;
  OrphanBuilder *result;
  
  allocation.value.super_ArrayPtr<unsigned_char>.size_._7_1_ = 0;
  OrphanBuilder((OrphanBuilder *)dst);
  this = tagAsPtr((OrphanBuilder *)dst);
  value.super_ArrayPtr<const_unsigned_char>.size_ = in_stack_ffffffffffffff60;
  value.super_ArrayPtr<const_unsigned_char>.ptr = (uchar *)src;
  WireHelpers::setDataPointer
            ((SegmentAnd<capnp::Data::Builder> *)local_50,(WireHelpers *)this,(WirePointer *)0x0,
             in_RDX,in_RCX,value,in_R8);
  *(undefined1 (*) [8])(dst + 8) = local_50;
  *(SegmentBuilder **)(dst + 0x10) = in_RDX;
  puVar1 = kj::ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)&allocation);
  *(uchar **)(dst + 0x18) = puVar1;
  return (int)dst;
}

Assistant:

OrphanBuilder OrphanBuilder::copy(
    BuilderArena* arena, CapTableBuilder* capTable, Data::Reader copyFrom) {
  OrphanBuilder result;
  auto allocation = WireHelpers::setDataPointer(
      result.tagAsPtr(), nullptr, capTable, copyFrom, arena);
  result.segment = allocation.segment;
  result.capTable = capTable;
  result.location = reinterpret_cast<word*>(allocation.value.begin());
  return result;
}